

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DimensionTests.cpp
# Opt level: O0

void __thiscall DimensionTest_Values_Test::TestBody(DimensionTest_Values_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffff20;
  Dimension *in_stack_ffffffffffffff28;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar2;
  char *in_stack_ffffffffffffff38;
  int line;
  char *in_stack_ffffffffffffff40;
  AssertionResult *this_02;
  Type in_stack_ffffffffffffff4c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar4;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_58;
  uint local_44;
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 1;
  local_20 = 1;
  testing::internal::EqHelper<false>::Compare<pica::Dimension,int>
            (in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff50 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1d52d9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,
               (Message *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
    testing::Message::~Message((Message *)0x1d5336);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d53a4);
  if (local_44 == 0) {
    this_02 = &local_58;
    testing::internal::EqHelper<false>::Compare<pica::Dimension,int>
              (in_stack_ffffffffffffff38,
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff38 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1d5462);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff50,type,&this_02->success_,
                 (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff80,
                 (Message *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0x1d54b6);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5521);
    if (local_44 == 0) {
      uVar4 = 3;
      uVar3 = 3;
      this_01 = (AssertionResult *)&stack0xffffffffffffff80;
      testing::internal::EqHelper<false>::Compare<pica::Dimension,int>
                (in_stack_ffffffffffffff38,
                 (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 (Dimension *)this_01,(int *)in_stack_ffffffffffffff20);
      line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
      if (!bVar1) {
        uVar2 = bVar1;
        testing::Message::Message((Message *)in_stack_ffffffffffffff50);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x1d55ca);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff50,type,&this_02->success_,line,
                   (char *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff80,(Message *)CONCAT44(uVar4,uVar3));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1d5618);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d567a);
    }
  }
  return;
}

Assistant:

TEST(DimensionTest, Values) {
    ASSERT_EQ(One, 1);
    ASSERT_EQ(Two, 2);
    ASSERT_EQ(Three, 3);
}